

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O0

uint Map_CutTableHash(Map_Node_t **ppNodes,int nNodes)

{
  int local_1c;
  uint local_18;
  int i;
  uint uRes;
  int nNodes_local;
  Map_Node_t **ppNodes_local;
  
  local_18 = 0;
  for (local_1c = 0; local_1c < nNodes; local_1c = local_1c + 1) {
    local_18 = s_HashPrimes[local_1c] * ppNodes[local_1c]->Num + local_18;
  }
  return local_18;
}

Assistant:

unsigned Map_CutTableHash( Map_Node_t * ppNodes[], int nNodes )
{
    unsigned uRes;
    int i;
    uRes = 0;
    for ( i = 0; i < nNodes; i++ )
        uRes += s_HashPrimes[i] * ppNodes[i]->Num;
    return uRes;
}